

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int verify_cert(ptls_verify_certificate_t *_self,ptls_t *tls,
               _func_int_void_ptr_ptls_iovec_t_ptls_iovec_t **verifier,void **verify_data,
               ptls_iovec_t *certs,size_t num_certs)

{
  X509_STORE *store;
  int is_server;
  stack_st_X509 *chain_00;
  X509 *x;
  X509 *pXVar1;
  char *server_name;
  EVP_PKEY *pEVar2;
  OPENSSL_STACK *pOVar3;
  OPENSSL_sk_freefunc p_Var4;
  X509 *interm;
  size_t sStack_58;
  int ret;
  size_t i;
  stack_st_X509 *chain;
  X509 *cert;
  ptls_openssl_verify_certificate_t *self;
  size_t num_certs_local;
  ptls_iovec_t *certs_local;
  void **verify_data_local;
  _func_int_void_ptr_ptls_iovec_t_ptls_iovec_t **verifier_local;
  ptls_t *tls_local;
  ptls_verify_certificate_t *_self_local;
  
  chain_00 = (stack_st_X509 *)OPENSSL_sk_new_null();
  if (num_certs == 0) {
    __assert_fail("num_certs != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/lib/openssl.c"
                  ,0x51c,
                  "int verify_cert(ptls_verify_certificate_t *, ptls_t *, int (**)(void *, ptls_iovec_t, ptls_iovec_t), void **, ptls_iovec_t *, size_t)"
                 );
  }
  x = (X509 *)to_x509(*certs);
  if (x == (X509 *)0x0) {
    interm._4_4_ = 0x2a;
  }
  else {
    for (sStack_58 = 1; sStack_58 != num_certs; sStack_58 = sStack_58 + 1) {
      pXVar1 = to_x509(certs[sStack_58]);
      if (pXVar1 == (X509 *)0x0) {
        interm._4_4_ = 0x2a;
        goto LAB_00110c3a;
      }
      pOVar3 = ossl_check_X509_sk_type(chain_00);
      pXVar1 = ossl_check_X509_type(pXVar1);
      OPENSSL_sk_push(pOVar3,pXVar1);
    }
    store = (X509_STORE *)_self[1].cb;
    is_server = ptls_is_server(tls);
    server_name = ptls_get_server_name(tls);
    interm._4_4_ = verify_cert_chain(store,(X509 *)x,chain_00,is_server,server_name);
    if (interm._4_4_ == 0) {
      pEVar2 = X509_get_pubkey(x);
      *verify_data = pEVar2;
      if (pEVar2 == (EVP_PKEY *)0x0) {
        interm._4_4_ = 0x2a;
      }
      else {
        *verifier = verify_sign;
      }
    }
  }
LAB_00110c3a:
  if (chain_00 != (stack_st_X509 *)0x0) {
    pOVar3 = ossl_check_X509_sk_type(chain_00);
    p_Var4 = ossl_check_X509_freefunc_type(X509_free);
    OPENSSL_sk_pop_free(pOVar3,p_Var4);
  }
  if (x != (X509 *)0x0) {
    X509_free(x);
  }
  return interm._4_4_;
}

Assistant:

static int verify_cert(ptls_verify_certificate_t *_self, ptls_t *tls, int (**verifier)(void *, ptls_iovec_t, ptls_iovec_t),
                       void **verify_data, ptls_iovec_t *certs, size_t num_certs)
{
    ptls_openssl_verify_certificate_t *self = (ptls_openssl_verify_certificate_t *)_self;
    X509 *cert = NULL;
    STACK_OF(X509) *chain = sk_X509_new_null();
    size_t i;
    int ret = 0;

    assert(num_certs != 0);

    /* convert certificates to OpenSSL representation */
    if ((cert = to_x509(certs[0])) == NULL) {
        ret = PTLS_ALERT_BAD_CERTIFICATE;
        goto Exit;
    }
    for (i = 1; i != num_certs; ++i) {
        X509 *interm = to_x509(certs[i]);
        if (interm == NULL) {
            ret = PTLS_ALERT_BAD_CERTIFICATE;
            goto Exit;
        }
        sk_X509_push(chain, interm);
    }

    /* verify the chain */
    if ((ret = verify_cert_chain(self->cert_store, cert, chain, ptls_is_server(tls), ptls_get_server_name(tls))) != 0)
        goto Exit;

    /* extract public key for verifying the TLS handshake signature */
    if ((*verify_data = X509_get_pubkey(cert)) == NULL) {
        ret = PTLS_ALERT_BAD_CERTIFICATE;
        goto Exit;
    }
    *verifier = verify_sign;

Exit:
    if (chain != NULL)
        sk_X509_pop_free(chain, X509_free);
    if (cert != NULL)
        X509_free(cert);
    return ret;
}